

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool ssl_prefs_check(Curl_easy *data)

{
  uint uVar1;
  uint uVar2;
  char *fmt;
  
  uVar2 = (uint)(data->set).ssl.primary.version;
  if (uVar2 < 8) {
    uVar1 = (data->set).ssl.primary.version_max;
    if ((uVar1 & 0xfffeffff) == 0) {
      return true;
    }
    if (uVar2 <= uVar1 >> 0x10) {
      return true;
    }
    fmt = "CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION";
  }
  else {
    fmt = "Unrecognized parameter value passed via CURLOPT_SSLVERSION";
  }
  Curl_failf(data,fmt);
  return false;
}

Assistant:

static bool ssl_prefs_check(struct Curl_easy *data)
{
  /* check for CURLOPT_SSLVERSION invalid parameter value */
  const unsigned char sslver = data->set.ssl.primary.version;
  if(sslver >= CURL_SSLVERSION_LAST) {
    failf(data, "Unrecognized parameter value passed via CURLOPT_SSLVERSION");
    return FALSE;
  }

  switch(data->set.ssl.primary.version_max) {
  case CURL_SSLVERSION_MAX_NONE:
  case CURL_SSLVERSION_MAX_DEFAULT:
    break;

  default:
    if((data->set.ssl.primary.version_max >> 16) < sslver) {
      failf(data, "CURL_SSLVERSION_MAX incompatible with CURL_SSLVERSION");
      return FALSE;
    }
  }

  return TRUE;
}